

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Fillet3.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction_Fillet3::ChFunction_Fillet3(ChFunction_Fillet3 *this,ChFunction_Fillet3 *other)

{
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_00b6c720;
  this->end = other->end;
  this->y1 = other->y1;
  this->y2 = other->y2;
  this->dy1 = other->dy1;
  this->dy2 = other->dy2;
  this->c1 = other->c1;
  this->c2 = other->c2;
  this->c3 = other->c3;
  this->c4 = other->c4;
  return;
}

Assistant:

ChFunction_Fillet3::ChFunction_Fillet3(const ChFunction_Fillet3& other) {
    end = other.end;
    y1 = other.y1;
    y2 = other.y2;
    dy1 = other.dy1;
    dy2 = other.dy2;
    c1 = other.c1;
    c2 = other.c2;
    c3 = other.c3;
    c4 = other.c4;
}